

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusWindow(ImGuiWindow *window)

{
  int *piVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ImGuiWindow **ppIVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ImGuiWindow **ppIVar11;
  ImGuiContext *g;
  ImGuiWindow *pIVar12;
  
  pIVar2 = GImGui;
  GImGui->FocusedWindow = window;
  if (window == (ImGuiWindow *)0x0) {
    return;
  }
  pIVar12 = window->RootWindow;
  if (window->RootWindow == (ImGuiWindow *)0x0) {
    pIVar12 = window;
  }
  uVar3 = pIVar12->Flags;
  if (((((uVar3 >> 0x19 & 1) != 0) && (pIVar2->ActiveId != 0)) &&
      (pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
     (pIVar2->ActiveIdWindow->RootWindow != pIVar12)) {
    pIVar2->ActiveId = 0;
    pIVar2->ActiveIdIsJustActivated = true;
    pIVar2->ActiveIdAllowOverlap = false;
    pIVar2->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  if ((uVar3 >> 0xd & 1) != 0) {
    return;
  }
  uVar5 = (ulong)(pIVar2->Windows).Size;
  if ((long)uVar5 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                  ,0x35d,"value_type &ImVector<ImGuiWindow *>::back() [T = ImGuiWindow *]");
  }
  ppIVar6 = (pIVar2->Windows).Data;
  if (ppIVar6[uVar5 - 1] == pIVar12) {
    return;
  }
  lVar9 = 0;
  do {
    if (*(ImGuiWindow **)((long)ppIVar6 + lVar9) == pIVar12) {
      memmove((void *)((long)ppIVar6 + lVar9),(void *)((long)ppIVar6 + lVar9 + 8),
              (uVar5 * 8 - lVar9) - 8);
      uVar3 = (pIVar2->Windows).Size - 1;
      uVar5 = (ulong)uVar3;
      (pIVar2->Windows).Size = uVar3;
      break;
    }
    lVar9 = lVar9 + 8;
  } while (uVar5 * 8 != lVar9);
  pIVar7 = GImGui;
  iVar4 = (int)uVar5;
  if (iVar4 != (pIVar2->Windows).Capacity) {
    ppIVar6 = (pIVar2->Windows).Data;
    goto LAB_00131f31;
  }
  if (iVar4 == 0) {
    iVar8 = 8;
  }
  else {
    iVar8 = ((int)(((uint)(uVar5 >> 0x1f) & 1) + iVar4) >> 1) + iVar4;
  }
  iVar10 = iVar4 + 1;
  if (iVar4 + 1 < iVar8) {
    iVar10 = iVar8;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  ppIVar6 = (ImGuiWindow **)(*(pIVar7->IO).MemAllocFn)((long)iVar10 << 3);
  ppIVar11 = (pIVar2->Windows).Data;
  if (ppIVar11 == (ImGuiWindow **)0x0) {
LAB_00131f14:
    ppIVar11 = (ImGuiWindow **)0x0;
    pIVar7 = GImGui;
  }
  else {
    memcpy(ppIVar6,ppIVar11,(long)(pIVar2->Windows).Size << 3);
    pIVar7 = GImGui;
    ppIVar11 = (pIVar2->Windows).Data;
    if (ppIVar11 == (ImGuiWindow **)0x0) goto LAB_00131f14;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar7->IO).MemFreeFn)(ppIVar11);
  (pIVar2->Windows).Data = ppIVar6;
  (pIVar2->Windows).Capacity = iVar10;
  iVar4 = (pIVar2->Windows).Size;
LAB_00131f31:
  (pIVar2->Windows).Size = iVar4 + 1;
  ppIVar6[iVar4] = pIVar12;
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    // Always mark the window we passed as focused. This is used for keyboard interactions such as tabbing.
    g.FocusedWindow = window;

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // And move its root window to the top of the pile
    if (window->RootWindow)
        window = window->RootWindow;

    // Steal focus on active widgets
    if (window->Flags & ImGuiWindowFlags_Popup) // FIXME: This statement should be unnecessary. Need further testing before removing it..
        if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != window)
            SetActiveID(0);

    // Bring to front
    if ((window->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus) || g.Windows.back() == window)
        return;
    for (int i = 0; i < g.Windows.Size; i++)
        if (g.Windows[i] == window)
        {
            g.Windows.erase(g.Windows.begin() + i);
            break;
        }
    g.Windows.push_back(window);
}